

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O1

int main(int argc,char **argv)

{
  int total;
  bool bVar1;
  Territory TVar2;
  int iVar3;
  MapcodeError MVar4;
  int iVar5;
  MapcodeError MVar6;
  Territory TVar7;
  Territory TVar8;
  uint uVar9;
  MapcodeError MVar10;
  int iVar11;
  unsigned_short *puVar12;
  size_t sVar13;
  TerritoryAlphabets *pTVar14;
  FILE *__stream;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  __int32_t **pp_Var18;
  undefined4 extraout_var;
  long lVar19;
  uint uVar20;
  int i_1;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  char **ppcVar24;
  long lVar25;
  Alphabet i;
  Alphabet AVar26;
  long *plVar27;
  int iVar28;
  int i_3;
  TerritoryBoundary *pTVar29;
  long lVar30;
  int iVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  int iStack_1601c;
  char s1_2 [1];
  undefined7 uStack_16017;
  unsigned_short u1 [1];
  double lon2;
  undefined8 uStack_15ff8;
  ulong uStack_15ff0;
  int iStack_15fe8;
  int iStack_15fe4;
  ulong uStack_15fe0;
  double dStack_15fd8;
  double lat3;
  char s1_1 [1];
  char acStack_15fc7 [2];
  char acStack_15fc5 [5];
  undefined3 uStack_15fc0;
  char acStack_15fbc [12];
  uint uStack_15fb0;
  char acStack_15fac [15971];
  undefined1 uStack_12149;
  char s1 [1];
  char largeString2 [10000];
  unsigned_short largeUnicodeString1 [10000];
  
  puts("Mapcode C Library Unit Tests");
  printf("Library version %s (data version %s)\n","2.5.5","2.3.0");
  printf("Using up to %d threads to test in parallel...\n",0x10);
  if ((argc != 1) || (argv == (char **)0x0)) {
    puts("*** ERROR *** unittest takes no arguments!");
    exit(1);
  }
  puts("-----------------------------------------------------------\nEnvironment tests");
  uVar22 = 0;
  printf("sizeof(char)=%ld, sizeof(UWORD)=%ld, sizeof(int)=%ld, sizeof(long int)=%ld char=%s\n",1,2,
         4,8,"signed");
  puts("-----------------------------------------------------------\nRobustness tests");
  testIncorrectGetTerritoryCode("UNKNOWN");
  testIncorrectGetTerritoryCode("A");
  testIncorrectGetTerritoryCode(" A");
  testIncorrectGetTerritoryCode("A ");
  testIncorrectGetTerritoryCode(" A ");
  testIncorrectGetTerritoryCode("AA");
  testIncorrectGetTerritoryCode(" AA");
  testIncorrectGetTerritoryCode("AA ");
  testIncorrectGetTerritoryCode(" AA ");
  testIncorrectGetTerritoryCode("US-");
  testIncorrectGetTerritoryCode(" US-");
  testIncorrectGetTerritoryCode("US- ");
  testIncorrectGetTerritoryCode(" US- ");
  testIncorrectGetTerritoryCode(" ");
  s1[0] = '\0';
  testIncorrectGetTerritoryCode(s1);
  do {
    iVar3 = (int)((uVar22 & 0xffffffff) * 0x25e22709 >> 0x20);
    uVar20 = ((uint)((int)uVar22 - iVar3) >> 1) + iVar3 >> 7;
    s1_1[uVar22] = (char)(uVar20 << 5) + (char)uVar20 + ' ' + (char)uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 15999);
  uVar22 = 0;
  uStack_12149 = 0;
  testIncorrectGetTerritoryCode(s1_1);
  testCorrectEncode(-90.0,0.0,1);
  testCorrectEncode(90.0,0.0,1);
  testCorrectEncode(-91.0,0.0,1);
  testCorrectEncode(91.0,0.0,1);
  testCorrectEncode(0.0,-180.0,1);
  testCorrectEncode(0.0,180.0,1);
  testCorrectEncode(1.0,-181.0,1);
  iVar3 = 1;
  testCorrectEncode(0.0,181.0,1);
  testIncorrectEncode(0.0,NAN,iVar3);
  testIncorrectEncode(NAN,0.0,iVar3);
  testIncorrectEncode(NAN,NAN,iVar3);
  iVar3 = 0;
  testCorrectEncode(INFINITY,0.0,0);
  testIncorrectEncode(0.0,INFINITY,iVar3);
  testIncorrectEncode(INFINITY,INFINITY,iVar3);
  iVar3 = 0;
  testCorrectEncode(-INFINITY,0.0,0);
  testIncorrectEncode(0.0,-INFINITY,iVar3);
  testIncorrectEncode(-INFINITY,-INFINITY,iVar3);
  testCorrectEncode(1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,1.79769313486232e+308,0);
  testCorrectEncode(1.79769313486232e+308,1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,-1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,-1.79769313486232e+308,0);
  TVar2 = getTerritoryCode("NLD",TERRITORY_NONE);
  testIncorrectDecode("",TERRITORY_NONE);
  testIncorrectDecode(" ",TERRITORY_NONE);
  testIncorrectDecode("AA",TERRITORY_NONE);
  testIncorrectDecode("",TVar2);
  testIncorrectDecode(" ",TVar2);
  testIncorrectDecode("AA",TVar2);
  testIncorrectDecode("XX.XX",TERRITORY_NONE);
  testCorrectDecode("NLD XX.XX",TVar2);
  testCorrectDecode("NLD 39.UC",TVar2);
  testCorrectDecode("W9.SX9",TVar2);
  testCorrectDecode("MEX 49.4V",TVar2);
  testCorrectDecode("NLD XX.XX",TERRITORY_NONE);
  testCorrectDecode("MX XX.XX",TERRITORY_NONE);
  s1_1[0] = '\0';
  testIncorrectDecode(s1_1,TERRITORY_NONE);
  testIncorrectDecode(s1_1,TVar2);
  testIncorrectDecode(s1_1,TERRITORY_NONE);
  testIncorrectDecode(s1_1,TVar2);
  puts("-----------------------------------------------------------\nAlphabet tests");
  s1_2[0] = '\0';
  do {
    iVar3 = (int)((uVar22 & 0xffffffff) * 0x25e22709 >> 0x20);
    uVar20 = ((uint)((int)uVar22 - iVar3) >> 1) + iVar3 >> 7;
    s1[uVar22] = (char)(uVar20 << 5) + (char)uVar20 + ' ' + (char)uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 19999);
  uVar22 = 0;
  do {
    iVar3 = (int)((uVar22 & 0xffffffff) * 0x25e22709 >> 0x20);
    uVar20 = ((uint)((int)uVar22 - iVar3) >> 1) + iVar3 >> 7;
    uVar20 = (uint)(byte)((char)(uVar20 << 5) + (char)uVar20 + 0x20) + (int)uVar22;
    uVar23 = (ulong)uVar20;
    largeString2[uVar22] = (char)uVar20;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 9999);
  largeString2[9999] = '\0';
  AVar26 = ALPHABET_ROMAN;
  do {
    pcVar15 = (char *)(ulong)(uint)AVar26;
    puVar12 = convertMapcodeToAlphabetUtf16(u1,"",AVar26);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar12 != (unsigned_short *)0x0),pcVar15,(int)uVar23);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 must return empty string",(uint)(*puVar12 == 0),
               pcVar15,(int)uVar23);
    myConvertToRoman(s1_2,u1);
    testAlphabetAssertion
              ("myConvertToRoman must return empty string",(uint)(s1_2[0] == '\0'),pcVar15,
               (int)uVar23);
    puVar12 = convertMapcodeToAlphabetUtf16(largeUnicodeString1,s1,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar12 != (unsigned_short *)0x0),pcVar15,(int)uVar23);
    myConvertToRoman(s1,puVar12);
    sVar13 = strlen(s1);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar13 < 20000),pcVar15,(int)uVar23);
    puVar12 = convertMapcodeToAlphabetUtf16((unsigned_short *)s1_1,largeString2,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar12 != (unsigned_short *)0x0),pcVar15,(int)uVar23);
    myConvertToRoman(largeString2,puVar12);
    sVar13 = strlen(largeString2);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar13 < 10000),pcVar15,(int)uVar23);
    AVar26 = AVar26 + ALPHABET_GREEK;
  } while (AVar26 != _ALPHABET_MAX);
  printf("%d alphabets\n",0x1c);
  uVar22 = 0;
  do {
    pcVar15 = (&testAlphabets_TEST_PAIRS)[uVar22];
    pcVar16 = (&PTR_anon_var_dwarf_2c33_002d9308)[uVar22];
    uVar23 = 0;
    do {
      AVar26 = (Alphabet)uVar23;
      convertMapcodeToAlphabetUtf16((unsigned_short *)s1,pcVar15,AVar26);
      convertMapcodeToAlphabetUtf8(s1_1,pcVar15,AVar26);
      decodeMapcodeToLatLonUtf16
                ((double *)largeString2,(double *)u1,(unsigned_short *)s1,TERRITORY_FRA,
                 (MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                ((double *)s1_2,&lon2,s1_1,TERRITORY_FRA,(MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                (&lat3,&dStack_15fd8,pcVar15,TERRITORY_FRA,(MapcodeElements *)largeUnicodeString1);
      if ((((((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_2[0])) ||
            (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_2[0])))) ||
           (_u1 != lon2)) || ((NAN(_u1) || NAN(lon2) || ((double)largeString2._0_8_ != lat3)))) ||
         (NAN((double)largeString2._0_8_) || NAN(lat3))) {
LAB_001ca690:
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** Difference in ascii/utf8/utf16 decoding %s\n",pcVar15);
      }
      else if ((_u1 != dStack_15fd8) || (NAN(_u1) || NAN(dStack_15fd8))) goto LAB_001ca690;
      myConvertToRoman(s1_1,(unsigned_short *)s1);
      iVar3 = strcmp(s1_1,pcVar16);
      if (iVar3 != 0) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myConvertToRoman(convertMapcodeToAlphabetUtf16(\"%s\",%d))=\"%s\"\n",
               pcVar15,uVar23,s1_1);
      }
      uVar23 = (ulong)(uint)(AVar26 + ALPHABET_GREEK);
    } while (AVar26 + ALPHABET_GREEK != 0x1c);
    bVar32 = uVar22 < 0xa2;
    uVar22 = uVar22 + 2;
  } while (bVar32);
  puts("-----------------------------------------------------------\nAlphabet per territory tests");
  TVar2 = TERRITORY_VAT;
  iVar3 = 0;
  do {
    pTVar14 = getAlphabetsForTerritory(TVar2);
    if (pTVar14->count - 4U < 0xfffffffd) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** Bad getAlphabetsForTerritory(%d) count: %d\n",(ulong)(uint)TVar2,
             (ulong)(uint)pTVar14->count);
    }
    iVar3 = iVar3 + 1;
    if (0 < pTVar14->count) {
      uVar22 = 0;
      do {
        if (0x1b < (uint)pTVar14->alphabet[uVar22]) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** Bad ALPHABETS_FOR_TERRITORY[%d].alphabet[%d]: %d\n",
                 (ulong)(uint)TVar2,uVar22 & 0xffffffff);
        }
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)pTVar14->count);
      iVar3 = iVar3 + (int)uVar22;
    }
    TVar2 = TVar2 + 1;
  } while (TVar2 != _TERRITORY_MAX);
  iStack_15fe4 = iVar3;
  puts("-----------------------------------------------------------\nParser tests");
  lVar30 = 0;
  do {
    pcVar15 = *(char **)((long)&testAlphabetParser_convertTests + lVar30);
    AVar26 = *(Alphabet *)((long)&DAT_002d98b8 + lVar30);
    convertMapcodeToAlphabetUtf8(s1_1,pcVar15,AVar26);
    pcVar16 = *(char **)((long)&PTR_anon_var_dwarf_3469_002d98c0 + lVar30);
    iVar3 = strcmp(s1_1,pcVar16);
    if (iVar3 != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** convertMapcodeToAlphabetUtf8(\"%s\",%d) returned \"%s\", (expected %s)\n"
             ,pcVar15,(ulong)(uint)AVar26,s1_1,pcVar16);
    }
    lVar30 = lVar30 + 0x18;
  } while (lVar30 != 0x78);
  uVar22 = 5;
  lVar30 = 8;
  do {
    pcVar15 = *(char **)((long)&PTR_anon_var_dwarf_329f_002d9818 + lVar30);
    MVar4 = decodeMapcodeToLatLonUtf8
                      ((double *)s1,(double *)largeUnicodeString1,pcVar15,TERRITORY_UNKNOWN,
                       (MapcodeElements *)s1_1);
    iVar3 = (int)uVar22;
    if (((uint)(MVar4 + ~ERR_BAD_MAPCODE_LENGTH) < 3) || (MVar4 == ERR_OK)) {
      pcVar16 = "NLD 49.YV\t";
      if (acStack_15fac[0] != '\0') {
        pcVar16 = " xx.xx-DD -";
      }
      sprintf(s1,"%s %s%s%s (%d;%d)",s1_1,acStack_15fbc,pcVar16 + 10,acStack_15fac,
              (ulong)(uint)_uStack_15fc0,(ulong)uStack_15fb0);
      iVar5 = strcmp(s1,*(char **)((long)&testAlphabetParser_parseTests + lVar30));
      if (iVar5 == 0) {
        pcVar16 = "NLD 49.YV\t";
        if (acStack_15fac[0] != '\0') {
          pcVar16 = " xx.xx-DD -";
        }
        sprintf((char *)largeUnicodeString1,"%s %s%s%s",s1_1,acStack_15fbc,pcVar16 + 10,
                acStack_15fac);
        MVar4 = decodeMapcodeToLatLonUtf8
                          ((double *)largeString2,(double *)u1,pcVar15,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        MVar6 = decodeMapcodeToLatLonUtf8
                          ((double *)s1_2,&lon2,(char *)largeUnicodeString1,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        if (MVar4 != ERR_OK || MVar6 != ERR_OK) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** decoding \"%s\" returns %d, decoding \"%s\" returns %d\n",pcVar15,
                 (ulong)(uint)MVar4,largeUnicodeString1,(ulong)(uint)MVar6);
        }
        if (((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_2[0])) ||
           (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_2[0])))) {
LAB_001caa98:
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          printf("*** ERROR *** decoding \"%s\" returns (%f,%f), decoding \"%s\" returns (%f,%f)\n",
                 largeString2._0_8_,_u1,CONCAT71(uStack_16017,s1_2[0]),lon2,pcVar15,
                 largeUnicodeString1);
        }
        else if ((_u1 != lon2) || (NAN(_u1) || NAN(lon2))) goto LAB_001caa98;
        uVar22 = (ulong)(iVar3 + 3);
      }
      else {
        uVar22 = (ulong)(iVar3 + 2);
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myParseMapcodeString(\"%s\") = \"%s\", (expected \"%s\")\n",pcVar15,s1
              );
      }
    }
    else {
      uVar22 = (ulong)(iVar3 + 1);
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** myParseMapcodeString(\"%s\") failed with error %d (expected %s)\n",
             pcVar15,(ulong)(uint)MVar4);
    }
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x98);
  puts("-----------------------------------------------------------\nTerritory name tests");
  iStack_15fe8 = testGetFullTerritoryName();
  puts("-----------------------------------------------------------\nTerritory tests");
  __stream = fopen("territories.csv","r");
  uStack_15fe0 = uVar22;
  if (__stream == (FILE *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    uVar22 = 0;
    printf("*** ERROR *** Can\'t read file %s\n","territories.csv");
  }
  else {
    pcVar15 = fgets(s1_1,0x200,__stream);
    uVar20 = 0;
    if ((pcVar15 != (char *)0x0) && (pcVar15 = fgets(s1_1,0x200,__stream), pcVar15 != (char *)0x0))
    {
      uVar20 = 0;
      do {
        pcVar15 = strchr(s1_1,0x2c);
        if (pcVar15 != (char *)0x0) {
          *pcVar15 = '\0';
          iVar3 = atoi(s1_1);
          uVar22 = (ulong)(iVar3 + 0x3e9);
          if (iVar3 < 0) {
            uVar22 = 0xffffffff;
          }
          pcVar15 = pcVar15 + 1;
          pcVar16 = strchr(pcVar15,0x2c);
          TVar2 = (Territory)uVar22;
          if (pcVar16 != (char *)0x0) {
            *pcVar16 = '\0';
            while (*pcVar15 != '\0') {
              pcVar17 = strchr(pcVar15,0x7c);
              if (pcVar17 != (char *)0x0) {
                *pcVar17 = '\0';
              }
              TVar7 = getTerritoryCode(pcVar15,TERRITORY_NONE);
              if (TVar7 != TVar2) {
                pthread_mutex_lock((pthread_mutex_t *)&mutex);
                nrErrors = nrErrors + 1;
                pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                printf("*** ERROR *** Territory string %s returns code %d, expected %d\n",pcVar15,
                       (ulong)(uint)TVar7);
              }
              pcVar15 = pcVar16;
              if (pcVar17 != (char *)0x0) {
                pcVar15 = pcVar17 + 1;
              }
            }
            pcVar15 = pcVar15 + 1;
          }
          pcVar16 = strchr(pcVar15,0x2c);
          if (pcVar16 != (char *)0x0) {
            pTVar14 = getAlphabetsForTerritory(TVar2);
            *pcVar16 = '\0';
            if (*pcVar15 == '\0') {
              lVar30 = 0;
            }
            else {
              lVar30 = 0;
              do {
                pcVar17 = strchr(pcVar15,0x7c);
                if (pcVar17 != (char *)0x0) {
                  *pcVar17 = '\0';
                }
                if ((pTVar14->count <= lVar30) ||
                   (AVar26 = atoi(pcVar15), AVar26 != pTVar14->alphabet[lVar30])) {
                  pthread_mutex_lock((pthread_mutex_t *)&mutex);
                  nrErrors = nrErrors + 1;
                  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                  atoi(pcVar15);
                  printf("*** ERROR *** Mismatch: alphabet %d of territory %d should be %d\n",
                         (ulong)((int)lVar30 + 1),uVar22);
                }
                pcVar15 = pcVar17 + 1;
                if (pcVar17 == (char *)0x0) {
                  pcVar15 = pcVar16;
                }
                lVar30 = lVar30 + 1;
              } while (*pcVar15 != '\0');
            }
            if ((int)lVar30 != pTVar14->count) {
              pthread_mutex_lock((pthread_mutex_t *)&mutex);
              nrErrors = nrErrors + 1;
              pthread_mutex_unlock((pthread_mutex_t *)&mutex);
              printf("*** ERROR *** %d alphabets for territory %d, expected %d\n",
                     (ulong)(uint)pTVar14->count,uVar22);
            }
            pcVar15 = pcVar15 + 1;
          }
          uVar20 = uVar20 + 1;
          pcVar16 = strchr(pcVar15,10);
          if (pcVar16 != (char *)0x0) {
            *pcVar16 = '\0';
            iVar3 = 0;
            do {
              iVar5 = getFullTerritoryNameInLocaleUtf8(s1,TVar2,iVar3,"en_US");
              pcVar16 = strstr(pcVar15,s1);
              if (pcVar16 == (char *)0x0) {
                pthread_mutex_lock((pthread_mutex_t *)&mutex);
                nrErrors = nrErrors + 1;
                pthread_mutex_unlock((pthread_mutex_t *)&mutex);
                printf("*** ERROR *** Name \"%s\" not found in \"%s\"\n",s1,pcVar15);
              }
              iVar3 = iVar3 + 1;
            } while (iVar5 == 0);
          }
        }
        pcVar15 = fgets(s1_1,0x200,__stream);
      } while (pcVar15 != (char *)0x0);
    }
    fclose(__stream);
    uVar22 = (ulong)uVar20;
  }
  printf("%d lines tested from %s\n",uVar22,"territories.csv");
  lVar30 = 0;
  iVar3 = 0;
  do {
    iVar28 = iVar3;
    pcVar15 = TEST_TERRITORIES[lVar30].codeISO;
    TVar2 = TEST_TERRITORIES[lVar30].territory;
    uStack_15ff8 = CONCAT44(uStack_15ff8._4_4_,TEST_TERRITORIES[lVar30].isAlias);
    iVar3 = TEST_TERRITORIES[lVar30].needsParent;
    TVar7 = TEST_TERRITORIES[lVar30].parent;
    uVar20 = 1;
    uVar22 = 0;
    uStack_15ff0 = lVar30;
    iVar5 = 0;
    do {
      iVar31 = iVar5;
      strcpy(s1,pcVar15);
      if (uVar20 == 1 && iVar3 == 0) {
        TVar8 = getTerritoryCode(s1,TERRITORY_NONE);
        iVar31 = iVar31 + 1;
        if (TVar8 != TVar2) {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          pcVar16 = getTerritoryIsoName(s1_1,TVar2,0);
          printf("*** ERROR *** getTerritoryCode(\'%s\')=%d but expected %d (%s)\n",s1,
                 (ulong)(uint)TVar8,TVar2,pcVar16);
        }
      }
      pp_Var18 = __ctype_tolower_loc();
      s1[uVar22] = (char)(*pp_Var18)[s1[uVar22]];
      TVar8 = getTerritoryCode(s1,TVar7);
      if (TVar8 != TVar2) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar16 = "";
        if (TVar7 != TERRITORY_UNKNOWN) {
          pcVar16 = getTerritoryIsoName(s1_1,TVar7,0);
        }
        printf("*** ERROR *** getTerritoryCode(\'%s\',%s)=%d but expected %d\n",s1,pcVar16,
               (ulong)(uint)TVar8,TVar2);
      }
      iVar5 = iVar31 + 1;
      uVar22 = (ulong)uVar20;
      sVar13 = strlen(pcVar15);
      uVar20 = uVar20 + 1;
    } while (uVar22 <= sVar13);
    if ((int)uStack_15ff8 == 0 && _TERRITORY_MIN < TVar7) {
      getTerritoryIsoName(s1_1,TVar2,0);
      iVar5 = iVar31 + 2;
      iVar3 = strcmp(s1_1,pcVar15);
      if ((iVar3 != 0) && (iVar3 = strcmp(acStack_15fc5,pcVar15), iVar3 != 0)) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** getTerritoryIsoName(%d)=\"%s\" which does not equal or contain \"%s\"\n"
               ,TVar2,s1_1,pcVar15);
      }
    }
    lVar30 = uStack_15ff0 + 1;
    iVar3 = iVar28 + iVar5;
  } while (lVar30 != 0x3c4);
  pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_NONE,0);
  if ((((*pcVar15 != '\0') ||
       (pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_UNKNOWN,0), *pcVar15 != '\0')) ||
      (pcVar15 = getTerritoryIsoName(s1_1,_TERRITORY_MIN,0), *pcVar15 != '\0')) ||
     (pcVar15 = getTerritoryIsoName(s1_1,_TERRITORY_MAX,0), *pcVar15 != '\0')) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    puts("*** ERROR *** getTerritoryIsoName returned nonempty for bad arguments");
  }
  TVar2 = getTerritoryCode((char *)0x0,TERRITORY_VAT);
  if (TVar2 != TERRITORY_NONE) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    puts("*** ERROR *** unexpected getTerritoryCode return for bad arguments");
  }
  pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_US_CA,1);
  iVar3 = strcmp(pcVar15,"CA");
  if (iVar3 == 0) {
    pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_IN_DD,1);
    iVar3 = strcmp(pcVar15,"DD");
    if (iVar3 == 0) {
      pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_NLD,1);
      iVar3 = strcmp(pcVar15,"NLD");
      if (iVar3 == 0) {
        pcVar15 = getTerritoryIsoName(s1_1,TERRITORY_USA,1);
        iVar3 = strcmp(pcVar15,"USA");
        if (iVar3 == 0) goto LAB_001cb27c;
      }
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  nrErrors = nrErrors + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  puts("*** ERROR *** getTerritoryIsoName returned bad short versions");
LAB_001cb27c:
  lVar30 = 0;
  do {
    TVar2 = (&testTerritoryCode_ptcTestData)[lVar30 * 2];
    TVar7 = getParentCountryOf(TVar2);
    if (TVar7 != (&DAT_001d2144)[lVar30 * 2]) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** getParentCountryOf(%d) returned unexpected %d\n",(ulong)(uint)TVar2,
             (ulong)(uint)TVar7);
    }
    lVar30 = lVar30 + 1;
  } while (lVar30 != 0x10);
  pcVar15 = "AL";
  lVar30 = 0;
  do {
    TVar2 = *(Territory *)((long)&testTerritoryCode_tcTestData + lVar30);
    TVar7 = *(Territory *)((long)&DAT_002df394 + lVar30);
    TVar8 = getTerritoryCode(pcVar15,TVar7);
    if (TVar8 != TVar2) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** getTerritoryCode(\"%s\", %d)=%d, expected %d\n",pcVar15,
             (ulong)(uint)TVar7,(ulong)(uint)TVar8,(ulong)(uint)TVar2);
    }
    pcVar15 = *(char **)((long)&DAT_002df3a8 + lVar30);
    lVar30 = lVar30 + 0x10;
  } while (lVar30 != 0x170);
  lVar30 = 0x18;
  do {
    pcVar15 = *(char **)(&UNK_002df4f8 + lVar30);
    TVar2 = getTerritoryCode(pcVar15,TERRITORY_NONE);
    dVar33 = *(double *)(&UNK_002df500 + lVar30);
    uVar9 = multipleBordersNearby(dVar33,*(double *)(&UNK_002df508 + lVar30),TVar2);
    uVar20 = *(uint *)((long)&DAT_002df510 + lVar30);
    if (uVar9 != uVar20) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** multipleBordersNearby(%+18.13f,%+18.13f, \"%s\") not %d\n",dVar33,
             pcVar15,(ulong)uVar20);
    }
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0x3f8);
  puts("-----------------------------------------------------------\nDistance tests");
  dVar33 = maxErrorInMeters(99);
  if ((dVar33 != 0.0) || (NAN(dVar33))) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    maxErrorInMeters(99);
    printf("*** ERROR *** maxErrorInMeters(99) = %f (expected 0.0)\n");
  }
  dVar33 = distanceInMeters(0.0,0.0,0.0,1.5);
  testDistance(166979.23618950002,dVar33);
  dVar33 = distanceInMeters(0.0,0.0,0.0,2.0);
  testDistance(222638.981586,dVar33);
  dVar33 = distanceInMeters(0.0,0.0,0.0,2.5);
  testDistance(278298.7269825,dVar33);
  dVar33 = distanceInMeters(0.0,-1.0,0.0,0.5);
  testDistance(166979.23618950002,dVar33);
  dVar33 = distanceInMeters(0.0,-1.0,0.0,1.0);
  testDistance(222638.981586,dVar33);
  dVar33 = distanceInMeters(0.0,-1.0,0.0,1.5);
  testDistance(278298.7269825,dVar33);
  dVar33 = distanceInMeters(0.0,0.5,0.0,-1.0);
  testDistance(166979.23618950002,dVar33);
  dVar33 = distanceInMeters(0.0,1.0,0.0,-1.0);
  testDistance(222638.981586,dVar33);
  dVar33 = distanceInMeters(0.0,1.5,0.0,-1.0);
  testDistance(278298.7269825,dVar33);
  dVar33 = distanceInMeters(0.0,359.0,0.0,0.5);
  testDistance(166979.23618950002,dVar33);
  dVar33 = distanceInMeters(0.0,359.0,0.0,1.0);
  testDistance(222638.981586,dVar33);
  dVar33 = distanceInMeters(0.0,359.0,0.0,1.5);
  testDistance(278298.7269825,dVar33);
  dVar33 = distanceInMeters(0.0,0.5,0.0,359.0);
  testDistance(166979.23618950002,dVar33);
  dVar33 = distanceInMeters(0.0,1.0,0.0,359.0);
  testDistance(222638.981586,dVar33);
  dVar33 = distanceInMeters(0.0,1.5,0.0,359.0);
  testDistance(278298.7269825,dVar33);
  dVar33 = distanceInMeters(0.5,0.0,-0.5,0.0);
  testDistance(110946.252133,dVar33);
  dVar33 = distanceInMeters(1.0,0.0,-0.0,0.0);
  testDistance(110946.252133,dVar33);
  dVar33 = distanceInMeters(0.0,0.0,-1.0,0.0);
  testDistance(110946.252133,dVar33);
  uVar22 = uStack_15fe0;
  iVar3 = iStack_15fe4;
  uVar23 = 0;
  do {
    dVar33 = distanceInMeters((double)(&testDistances_coordpairs)[uVar23],
                              (double)(&DAT_001d21c8)[uVar23],(double)(&DAT_001d21d0)[uVar23],
                              (double)(&DAT_001d21d8)[uVar23]);
    dVar34 = floor(dVar33 * 100000.0 + 0.5);
    if ((dVar34 != (double)(&DAT_001d21e0)[uVar23]) ||
       (NAN(dVar34) || NAN((double)(&DAT_001d21e0)[uVar23]))) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** distanceInMeters %d failed: %f\n",dVar33,uVar23 & 0xffffffff);
    }
    uVar23 = uVar23 + 5;
  } while ((int)uVar23 != 0x4b);
  puts("-----------------------------------------------------------\nMapcode format tests");
  iStack_1601c = iVar28 + (int)uVar22 + iVar5 + iStack_15fe8 + iVar3 + 0x13de;
  pcVar15 = "nld bc.xy-x1y";
  plVar27 = (long *)(testMapcodeFormats_formattests + 0x10);
  uVar21 = 0;
  uVar20 = 0;
  uVar9 = 0;
  do {
    MVar4 = decodeMapcodeToLatLonUtf8
                      ((double *)s1,(double *)largeUnicodeString1,pcVar15,TERRITORY_UNKNOWN,
                       (MapcodeElements *)s1_1);
    if ((uint)(MVar4 + ~ERR_BAD_MAPCODE_LENGTH) < 3) {
      MVar4 = ERR_OK;
    }
    MVar10 = compareWithMapcodeFormatUtf8(pcVar15);
    MVar6 = *(MapcodeError *)(plVar27 + -1);
    uVar20 = uVar20 + (MVar6 == ERR_OK);
    if ((MVar4 != MVar10) && (MVar6 != ERR_UNKNOWN_TERRITORY || MVar10 != ERR_OK)) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** \"%s\" : myParseMapcodeString=%d, compareWithMapcodeFormatUtf8=%d\n",
             pcVar15,(ulong)(uint)MVar4);
    }
    if (MVar6 != MVar4) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** compareWithMapcodeFormatUtf8(\"%s\") returns %d (%d expected)\n",pcVar15
             ,(ulong)(uint)MVar4);
    }
    if (MVar4 == ERR_OK) {
      MVar4 = decodeMapcodeToLatLonUtf8
                        ((double *)s1,(double *)largeUnicodeString1,pcVar15,TERRITORY_UNKNOWN,
                         (MapcodeElements *)0x0);
      if (MVar4 != *(MapcodeError *)((long)plVar27 + -4)) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        printf("*** ERROR *** myParseMapcodeString(\"%s\")=%d, expected %d\n",pcVar15,
               (ulong)(uint)MVar4);
      }
      uVar9 = uVar9 + 1;
    }
    pcVar15 = (char *)*plVar27;
    uVar21 = uVar21 + 1;
    plVar27 = plVar27 + 2;
    iStack_1601c = iStack_1601c + 3;
  } while (pcVar15 != (char *)0x0);
  if (uVar9 != uVar20) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    printf("*** ERROR *** %d of %d myParseMapcodeString() calls succeeded (expected %d)\n",
           (ulong)uVar9,(ulong)uVar21);
  }
  lVar30 = 0;
  do {
    pcVar15 = *(char **)((long)&testFailingDecodes_badcodes + lVar30);
    MVar4 = decodeMapcodeToLatLonUtf8
                      ((double *)s1_1,(double *)s1,pcVar15,TERRITORY_UNKNOWN,(MapcodeElements *)0x0)
    ;
    if (~ERR_OK < MVar4) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** invalid mapcode \"%s\" decodes without error\n",pcVar15);
    }
    lVar30 = lVar30 + 8;
  } while (lVar30 != 0x1b8);
  puts("-----------------------------------------------------------\nEncode/decode tests");
  pcVar15 = "NLD GG.LCG-RJQ4";
  lVar30 = 0;
  do {
    encodeLatLonToSingleMapcode
              (s1_1,*(double *)((long)&DAT_002e0d00 + lVar30),
               *(double *)((long)&DAT_002e0d08 + lVar30),
               *(Territory *)((long)&DAT_002e0d10 + lVar30),4);
    iVar3 = strcmp(s1_1,pcVar15);
    if (iVar3 != 0) {
      printf("*** ERROR *** encodeLatLonToSingleMapcode()=%s, expected %s\n",s1_1,pcVar15);
    }
    pcVar15 = *(char **)((long)&PTR_anon_var_dwarf_6244_002e0d38 + lVar30);
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0x60);
  uVar22 = 0;
  do {
    uVar20 = encodeLatLonToSelectedMapcode(s1_1,52.158993,4.492346,TERRITORY_NONE,0,(int)uVar22);
    if (uVar20 != 4) {
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)uVar20);
    }
    switch(uVar22) {
    case 0:
      if (CONCAT35(uStack_15fc0,CONCAT32(acStack_15fc5._2_3_,acStack_15fc5._0_2_)) !=
          0x47302e4d4a5120 ||
          CONCAT35(acStack_15fc5._2_3_,CONCAT23(acStack_15fc5._0_2_,CONCAT21(acStack_15fc7,s1_1[0]))
                  ) != 0x2e4d4a5120444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar15 = "NLD QJM.0G";
LAB_001cbc60:
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,pcVar15,s1_1);
      }
      break;
    case 1:
      if (_uStack_15fc0 != 0x433531 ||
          CONCAT35(acStack_15fc5._2_3_,CONCAT23(acStack_15fc5._0_2_,CONCAT21(acStack_15fc7,s1_1[0]))
                  ) != 0x2e515a4320444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar15 = "NLD CZQ.15C";
        goto LAB_001cbc60;
      }
      break;
    case 2:
      if (CONCAT17(acStack_15fbc[0],CONCAT43(_uStack_15fc0,acStack_15fc5._2_3_)) != 0x4e5a4d2e4a3933
          || CONCAT35(acStack_15fc5._2_3_,
                      CONCAT23(acStack_15fc5._0_2_,CONCAT21(acStack_15fc7,s1_1[0]))) !=
             0x4a39334e20444c4e) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar15 = "NLD N39J.MZN";
        goto LAB_001cbc60;
      }
      break;
    case 3:
      if (CONCAT35(uStack_15fc0,CONCAT32(acStack_15fc5._2_3_,acStack_15fc5._0_2_)) !=
          0x53395a542e344e ||
          CONCAT35(acStack_15fc5._2_3_,CONCAT23(acStack_15fc5._0_2_,CONCAT21(acStack_15fc7,s1_1[0]))
                  ) != 0x5a542e344e564856) {
        pthread_mutex_lock((pthread_mutex_t *)&mutex);
        nrErrors = nrErrors + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        pcVar15 = "VHVN4.TZ9S";
        goto LAB_001cbc60;
      }
      break;
    default:
      pthread_mutex_lock((pthread_mutex_t *)&mutex);
      nrErrors = nrErrors + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,uVar22);
    }
    uVar9 = (int)uVar22 + 1;
    uVar22 = (ulong)uVar9;
  } while ((int)uVar9 < (int)uVar20);
  lVar30 = 0;
  printf("%d encodes\n",0x3dee);
  ppcVar24 = &ENCODE_TEST[0].mapcode;
  uVar20 = 0;
  do {
    uVar22 = (ulong)uVar20;
    showTestProgress((int)lVar30,0x3dee,uVar20);
    iVar3 = testEncodeAndDecode(*ppcVar24,((EncodeTestRecord *)(ppcVar24 + -3))->latitude,
                                (double)ppcVar24[-2],*(int *)(ppcVar24 + -1),
                                *(int *)((long)ppcVar24 + -4));
    uVar20 = iVar3 + uVar20;
    lVar30 = lVar30 + 1;
    ppcVar24 = ppcVar24 + 4;
  } while (lVar30 != 0x3dee);
  uStack_15ff8 = CONCAT44(extraout_var,iVar3);
  uStack_15ff0 = uVar22;
  puts("-----------------------------------------------------------\nRe-encode tests");
  iVar3 = 0;
  printf("%d records\n",0x3fe4);
  lVar30 = 0x3e9;
  iVar5 = 0;
  do {
    iVar28 = *(int *)(lVar30 * 4 + 0x1d147c);
    lVar25 = (long)iVar28;
    iVar31 = *(int *)(lVar30 * 4 + 0x1d1480);
    showTestProgress(iVar31,0x3fe4,iVar3);
    bVar32 = iVar28 < iVar31;
    if (iVar28 < iVar31) {
      iVar28 = iVar31 - iVar28;
      pTVar29 = TERRITORY_BOUNDARIES + lVar25;
      bVar32 = true;
      do {
        lVar25 = lVar25 + 1;
        lVar19 = (long)iVar5;
        pcVar15 = s1_1 + lVar19 * 0x10;
        pcVar15[0] = '\0';
        pcVar15[1] = '\0';
        pcVar15[2] = '\0';
        pcVar15[3] = '\0';
        *(TerritoryBoundary **)(&uStack_15fc0 + lVar19 * 4) = pTVar29;
        iVar11 = pthread_create((pthread_t *)(s1 + lVar19 * 8),(pthread_attr_t *)0x0,
                                executeTestAround,pcVar15);
        if (iVar11 == 0) {
          total = iVar5 + 1;
          bVar1 = 0xe < iVar5;
          iVar5 = total;
          if (bVar1) {
            iVar5 = joinThreads((pthread_t *)s1,(ContextTestAround *)s1_1,total);
            iVar3 = iVar3 + iVar5;
            iVar5 = 0;
          }
        }
        else {
          pthread_mutex_lock((pthread_mutex_t *)&mutex);
          nrErrors = nrErrors + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          puts("*** ERROR *** Cannot create thread");
        }
        if (iVar11 != 0) goto LAB_001cbe6a;
        bVar32 = lVar25 < iVar31;
        pTVar29 = pTVar29 + 1;
        iVar28 = iVar28 + -1;
      } while (iVar28 != 0);
    }
    iVar5 = joinThreads((pthread_t *)s1,(ContextTestAround *)s1_1,iVar5);
    iVar3 = iVar3 + iVar5;
    iVar5 = 0;
LAB_001cbe6a:
    if (bVar32) {
      iVar3 = 0;
      goto LAB_001cbe89;
    }
    lVar30 = lVar30 + 1;
    if (lVar30 == 0x5fe) {
LAB_001cbe89:
      iVar5 = (int)uStack_15ff8 + (int)uStack_15ff0;
      puts("-----------------------------------------------------------");
      printf("Done.\nExecuted %d tests, found %d errors\n",
             (ulong)(uint)(iVar5 + iVar3 + iStack_1601c),(ulong)(uint)nrErrors);
      pcVar15 = "Unit tests passed";
      if (0 < nrErrors) {
        pcVar15 = "UNIT TESTS FAILED!";
      }
      puts(pcVar15);
      return nrErrors;
    }
  } while( true );
}

Assistant:

int main(const int argc, const char **argv) {
    int nrTests = 0;

    // Ref unused var.
    REF(ISO3166_ALPHA[0]);

    printf("Mapcode C Library Unit Tests\n");
    printf("Library version %s (data version %s)\n", MAPCODE_C_VERSION, MAPCODE_DATA_VERSION);
#ifdef NO_POSIX_THREADS
    printf("Compiler options: NO_POSIX_THREADS\n");
#else
    printf("Using up to %d threads to test in parallel...\n", MAX_THREADS);
#endif

    if (argc != 1 || argv == NULL) {
        printf("*** ERROR *** unittest takes no arguments!\n");
        exit(1);
    }

    printf("-----------------------------------------------------------\nEnvironment tests\n");
    nrTests += testEnvironment();

    printf("-----------------------------------------------------------\nRobustness tests\n");
    nrTests += testRobustness();

    printf("-----------------------------------------------------------\nAlphabet tests\n");
    nrTests += testAlphabetRobustness();
    nrTests += testAlphabets();

    printf("-----------------------------------------------------------\nAlphabet per territory tests\n");
    nrTests += testAlphabetPerTerritory();

    printf("-----------------------------------------------------------\nParser tests\n");
    nrTests += testAlphabetParser();

    printf("-----------------------------------------------------------\nTerritory name tests\n");
    nrTests += testGetFullTerritoryName();

    printf("-----------------------------------------------------------\nTerritory tests\n");
    nrTests += testTerritoriesCsv();
    nrTests += testTerritories();
    nrTests += testTerritoryCode();
    nrTests += testTerritoryInsides();

    printf("-----------------------------------------------------------\nDistance tests\n");
    nrTests += testDistances();

    printf("-----------------------------------------------------------\nMapcode format tests\n");
    nrTests += testMapcodeFormats();
    nrTests += testFailingDecodes();

    printf("-----------------------------------------------------------\nEncode/decode tests\n");
    nrTests += testSingleEncodes();
    nrTests += testSelectedEncodes();
    nrTests += testEncodeDecode();

    printf("-----------------------------------------------------------\nRe-encode tests\n");
    nrTests += testReEncode();

    printf("-----------------------------------------------------------\n");
    printf("Done.\nExecuted %d tests, found %d errors\n", nrTests, nrErrors);
    if (nrErrors > 0) {
        printf("UNIT TESTS FAILED!\n");
    } else {
        printf("Unit tests passed\n");
    }
    return nrErrors;
}